

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmLocalNinjaGenerator::WritePools(cmLocalNinjaGenerator *this,ostream *os)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmState *this_00;
  int iVar2;
  char *__s;
  size_t sVar3;
  long lVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  string pool;
  uint jobs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pools;
  string local_90;
  undefined1 local_6c [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  cmGlobalNinjaGenerator::WriteDivider(os);
  this_00 = ((this->super_cmLocalGenerator).GlobalGenerator)->CMakeInstance->State;
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"JOB_POOLS","");
  __s = cmState::GetGlobalProperty(this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (__s != (char *)0x0) {
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Pools defined by global property JOB_POOLS","");
    cmGlobalNinjaGenerator::WriteComment(os,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar3);
    cmSystemTools::ExpandListArgument(&local_90,&local_68,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar6 = 8;
      uVar7 = 0;
      do {
        lVar4 = *(long *)((long)local_68.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar6 + -8);
        local_90._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,lVar4,
                   *(long *)((long)&((local_68.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar6) + lVar4);
        lVar4 = std::__cxx11::string::find((char *)&local_90,0x5bde87,0);
        if (lVar4 == -1) {
LAB_00396398:
          cmSystemTools::Error
                    ("Invalid pool defined by property \'JOB_POOLS\': ",local_90._M_dataplus._M_p,
                     (char *)0x0,(char *)0x0);
        }
        else {
          iVar2 = __isoc99_sscanf(local_90._M_dataplus._M_p + lVar4,"=%u",local_6c);
          if (iVar2 != 1) goto LAB_00396398;
          std::__ostream_insert<char,std::char_traits<char>>(os,"pool ",5);
          std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_90);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          if (local_50 != local_40) {
            operator_delete(local_50,local_40[0] + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,"  depth = ",10);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          std::ios::widen((char)os->_vptr_basic_ostream[-3] + (char)os);
          std::ostream::put((char)os);
          std::ostream::flush();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x20;
      } while (uVar7 < (ulong)((long)local_68.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_68.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::WritePools(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);

  const char* jobpools = this->GetCMakeInstance()->GetState()
                             ->GetGlobalProperty("JOB_POOLS");
  if (jobpools)
    {
    cmGlobalNinjaGenerator::WriteComment(os,
                            "Pools defined by global property JOB_POOLS");
    std::vector<std::string> pools;
    cmSystemTools::ExpandListArgument(jobpools, pools);
    for (size_t i = 0; i < pools.size(); ++i)
      {
      const std::string pool = pools[i];
      const std::string::size_type eq = pool.find("=");
      unsigned int jobs;
      if (eq != std::string::npos &&
          sscanf(pool.c_str() + eq, "=%u", &jobs) == 1)
        {
        os << "pool " << pool.substr(0, eq) << std::endl;
        os << "  depth = " << jobs << std::endl;
        os << std::endl;
        }
      else
        {
        cmSystemTools::Error("Invalid pool defined by property 'JOB_POOLS': ",
                             pool.c_str());
        }
      }
    }
}